

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

int __thiscall QColorDialogPrivate::init(QColorDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  QPlatformDialogHelper *pQVar1;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QDialog::setSizeGripEnabled((QDialog *)this_00,false);
  QMetaObject::tr((char *)&local_40,(char *)&QColorDialog::staticMetaObject,0x6e4740);
  QWidget::setWindowTitle(this_00,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = QDialogPrivate::platformHelper(&this->super_QDialogPrivate);
  (this->super_QDialogPrivate).nativeDialogInUse = pQVar1 != (QPlatformDialogHelper *)0x0;
  this->colorPickingEventFilter = (QColorPickingEventFilter *)0x0;
  this->nextCust = 0;
  if (pQVar1 == (QPlatformDialogHelper *)0x0) {
    initWidgets(this);
  }
  setCurrentColor(*(QColorDialogPrivate **)&this_00->field_0x8,(QColor *)ctx,SetColorAll);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::init(const QColor &initial)
{
    Q_Q(QColorDialog);

    q->setSizeGripEnabled(false);
    q->setWindowTitle(QColorDialog::tr("Select Color"));

    // default: use the native dialog if possible.  Can be overridden in setOptions()
    nativeDialogInUse = (platformColorDialogHelper() != nullptr);
    colorPickingEventFilter = nullptr;
    nextCust = 0;

    if (!nativeDialogInUse)
        initWidgets();

#ifdef Q_OS_WIN32
    dummyTransparentWindow.resize(1, 1);
    dummyTransparentWindow.setFlags(Qt::Tool | Qt::FramelessWindowHint);
#endif

    q->setCurrentColor(initial);
}